

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O2

_Bool borg_flow_take_lunal(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc_conflict grid2;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  bool bVar11;
  ulong uVar12;
  uint8_t *puVar13;
  object_kind *poVar14;
  borg_take *pbVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  if (borg_takes_cnt != 0) {
    uVar17 = 0xffffffff;
    wVar9 = L'\xffffffff';
    for (uVar18 = 0; (long)uVar18 < (long)track_less.num; uVar18 = uVar18 + 1) {
      grid2 = loc(track_less.x[uVar18],track_less.y[uVar18]);
      wVar4 = distance(borg.c,grid2);
      wVar10 = wVar9;
      if (wVar9 <= wVar4) {
        wVar10 = wVar4;
      }
      if (wVar9 < wVar4) {
        uVar17 = uVar18 & 0xffffffff;
      }
      wVar9 = wVar10;
    }
    borg_temp_n = 0;
    for (lVar19 = 1; lVar19 < borg_takes_nxt; lVar19 = lVar19 + 1) {
      poVar14 = borg_takes[lVar19].kind;
      if (poVar14 != (object_kind *)0x0) {
        pbVar15 = borg_takes + lVar19;
        bVar1 = pbVar15->x;
        bVar2 = pbVar15->y;
        uVar16 = (ulong)bVar1;
        uVar18 = (ulong)bVar2;
        if (pbVar15->tval == L'#') {
          bVar11 = false;
          pcVar5 = format("# Lunal Item %s, at %d,%d",poVar14->name,uVar18,uVar16);
          borg_note(pcVar5);
        }
        else {
          bVar11 = true;
          if (L'\0' < pbVar15->value) {
            _Var3 = borg_is_ammo(pbVar15->tval);
            if (_Var3) {
              uVar12 = (ulong)z_info->pack_size;
              puVar13 = &borg_items[uVar12 + 0xc].iqty;
              bVar11 = true;
              for (uVar7 = uVar12 + 0xc; uVar7 < z_info->quiver_size + uVar12 + 0xc;
                  uVar7 = uVar7 + 1) {
                if (((*puVar13 != 0) && (z_info->quiver_slot_size != (ushort)*puVar13)) &&
                   ((pbVar15->kind->kidx == *(uint32_t *)(puVar13 + -0xc) &&
                    (poVar14->sval == (uint)puVar13[-3])))) {
                  bVar11 = (bool)(bVar11 & poVar14->tval != (uint)puVar13[-4]);
                }
                puVar13 = puVar13 + 0x388;
              }
            }
            else if (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty != '\0') {
              uVar6 = (uint)z_info->pack_size - borg.trait[0x9e];
              uVar7 = (ulong)uVar6;
              if ((int)uVar6 < 1) {
                uVar7 = 0;
              }
              bVar11 = true;
              for (lVar8 = 0; uVar7 * 0x388 - lVar8 != 0; lVar8 = lVar8 + 0x388) {
                if (((borg_items->curses[lVar8 + -0x26] != false) &&
                    (pbVar15->kind->kidx == *(uint32_t *)(borg_items->curses + lVar8 + -0x32))) &&
                   (poVar14->sval == (uint)borg_items->curses[lVar8 + -0x29])) {
                  bVar11 = (bool)(bVar11 & ((byte)(borg_items->curses[lVar8 + -0x2a] - 0x1bU) < 0xfd
                                           || poVar14->tval !=
                                              (uint)borg_items->curses[lVar8 + -0x2a]));
                }
              }
            }
          }
        }
        if (((borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty == '\0') &&
            (bVar11)) &&
           ((_Var3 = borg_is_ammo(pbVar15->tval), !_Var3 ||
            (borg_items[(ulong)z_info->quiver_size + (ulong)z_info->pack_size + 0xb].iqty == '\0')))
           ) {
          poVar14 = pbVar15->kind;
          if (((pbVar15->tval == L'\x1a') && (sv_potion_inc_str <= poVar14->sval)) &&
             (poVar14->sval <= sv_potion_detect_invis)) {
            pcVar5 = format("# Lunal Item %s, at %d,%d",poVar14->name,uVar18,uVar16);
            borg_note(pcVar5);
            poVar14 = pbVar15->kind;
          }
          _Var3 = flag_has_dbg(poVar14->kind_flags,2,4,"take->kind->kind_flags","KF_INSTA_ART");
          if (_Var3) {
            pcVar5 = format("# Lunal Item %s, at %d,%d",pbVar15->kind->name,uVar18);
            borg_note(pcVar5);
          }
        }
        if (((!viewable) || ((borg_grids[uVar18][uVar16].info & 0x20) != 0)) &&
           (_Var3 = borg_flow_far_from_stairs((uint)bVar1,(uint)bVar2,(wchar_t)uVar17), !_Var3)) {
          borg_temp_x[borg_temp_n] = bVar1;
          borg_temp_y[borg_temp_n] = bVar2;
          borg_temp_n = borg_temp_n + 1;
        }
      }
    }
    if (borg_temp_n != 0) {
      borg_flow_clear();
      for (lVar19 = 0; lVar19 < borg_temp_n; lVar19 = lVar19 + 1) {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar19],(uint)borg_temp_x[lVar19]);
      }
      borg_flow_spread(nearness,false,!viewable,false,L'\xffffffff',true);
      _Var3 = borg_flow_commit("munchkin item",L'\x02');
      if (!_Var3) {
        return false;
      }
      _Var3 = borg_check_light();
      if (_Var3) {
        return true;
      }
      _Var3 = borg_flow_old(L'\x02');
      return _Var3;
    }
  }
  return false;
}

Assistant:

bool borg_flow_take_lunal(bool viewable, int nearness)
{
    int i, ii, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Nothing yet */
    borg_temp_n = 0;

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take          *take  = &borg_takes[i];
        struct object_kind *k_ptr = take->kind;

        bool item_bad;

        /* Skip dead objects */
        if (!k_ptr)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* all items start bad */
        item_bad = true;

        /* Gold is good to have */
        if (take->tval == TV_GOLD) {
            borg_note(
                format("# Lunal Item %s, at %d,%d", take->kind->name, y, x));
            item_bad = false;
        }

        /* If full can I absorb the item into an existing stack */
        if (item_bad && take->value > 0) {
            if (borg_is_ammo(take->tval)) {
                /* Scan the quiver */
                for (ii = QUIVER_START; ii < QUIVER_END; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* skip full slots */
                    if (borg_items[ii].iqty == z_info->quiver_slot_size)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval) {
                        item_bad = false;
                    }
                }
            } else if (borg_items[PACK_SLOTS - 1].iqty) {
                /* Scan the inventory */
                for (ii = 0; ii < PACK_SLOTS; ii++) {
                    /* skip empty slots */
                    if (!borg_items[ii].iqty)
                        continue;

                    /* Both objects should have the same kind value */
                    if (take->kind->kidx != borg_items[ii].kind)
                        continue;

                    /* Certain types of items can stack */
                    if (k_ptr->sval == borg_items[ii].sval
                        && k_ptr->tval == borg_items[ii].tval
                        && (borg_items[ii].tval == TV_POTION
                            || borg_items[ii].tval == TV_SCROLL
                            || borg_items[ii].tval == TV_ROD)) {
                        item_bad = false;
                    }
                }
            }
        }

        /* Require one empty slot */
        if (!borg_items[PACK_SLOTS - 1].iqty && item_bad == true) {
            /* for ammo, make sure the quiver isn't full */
            if (!borg_is_ammo(take->tval)
                || borg_items[QUIVER_END - 1].iqty == 0) {

                /* Certain Potions are worthless */
                if (take->tval == TV_POTION
                    && (take->kind->sval >= sv_potion_inc_str)
                    && (take->kind->sval <= sv_potion_detect_invis)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* Certain insta_arts are good.  Note that there is no top end
                 * of this.  So if an item were added after the last artifact,
                 * it would also be picked up.
                 */
                if (kf_has(take->kind->kind_flags, KF_INSTA_ART)) {
                    borg_note(format(
                        "# Lunal Item %s, at %d,%d", take->kind->name, y, x));
                    item_bad = false;
                }

                /* if scumming the start of the game, take all items to sell
                 * them */
                if (borg_cfg[BORG_MUNCHKIN_START]) {
                    /* Certain known items are junky and should be ignored. Grab
                     * only things of value
                     */
                    if (take->value >= 1)
                        item_bad = false;
                }
            }
        }

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, false, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("munchkin item", GOAL_TAKE))
        return false;

    /* Check for monsters before walking over to the item */
    if (borg_check_light())
        return true;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}